

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_set.cpp
# Opt level: O2

void __thiscall
duckdb::CatalogEntryMap::AddEntry
          (CatalogEntryMap *this,
          unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> *entry)

{
  pointer pCVar1;
  iterator iVar2;
  InternalException *this_00;
  allocator local_89;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>
  local_88;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  pCVar1 = unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>::
           operator->(entry);
  ::std::__cxx11::string::string((string *)&name,(string *)&pCVar1->name);
  iVar2 = ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>,_duckdb::CaseInsensitiveStringCompare,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>,_duckdb::CaseInsensitiveStringCompare,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>_>
                  *)this,&name);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->entries)._M_t._M_impl.super__Rb_tree_header) {
    ::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>,_true>
              (&local_88,&name,entry);
    ::std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::CatalogEntry,std::default_delete<duckdb::CatalogEntry>,true>>,std::_Select1st<std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::CatalogEntry,std::default_delete<duckdb::CatalogEntry>,true>>>,duckdb::CaseInsensitiveStringCompare,std::allocator<std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::CatalogEntry,std::default_delete<duckdb::CatalogEntry>,true>>>>
    ::
    _M_emplace_unique<std::pair<std::__cxx11::string,duckdb::unique_ptr<duckdb::CatalogEntry,std::default_delete<duckdb::CatalogEntry>,true>>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::CatalogEntry,std::default_delete<duckdb::CatalogEntry>,true>>,std::_Select1st<std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::CatalogEntry,std::default_delete<duckdb::CatalogEntry>,true>>>,duckdb::CaseInsensitiveStringCompare,std::allocator<std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::CatalogEntry,std::default_delete<duckdb::CatalogEntry>,true>>>>
                *)this,&local_88);
    ::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>
    ::~pair(&local_88);
    ::std::__cxx11::string::~string((string *)&name);
    return;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_88,"Entry with name \"%s\" already exists",&local_89);
  ::std::__cxx11::string::string((string *)&local_40,(string *)&name);
  InternalException::InternalException<std::__cxx11::string>(this_00,&local_88.first,&local_40);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void CatalogEntryMap::AddEntry(unique_ptr<CatalogEntry> entry) {
	auto name = entry->name;

	if (entries.find(name) != entries.end()) {
		throw InternalException("Entry with name \"%s\" already exists", name);
	}
	entries.insert(make_pair(name, std::move(entry)));
}